

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_printf_describe(roaring_bitmap_t *r)

{
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  
  putchar(0x7b);
  if (0 < (r->high_low_container).size) {
    (*(code *)(&DAT_00120194 +
              *(int *)(&DAT_00120194 + (ulong)(*(r->high_low_container).typecodes - 1) * 4)))
              (*(r->high_low_container).containers,in_RSI,extraout_RDX,
               &DAT_00120194 +
               *(int *)(&DAT_00120194 + (ulong)(*(r->high_low_container).typecodes - 1) * 4));
    return;
  }
  putchar(0x7d);
  return;
}

Assistant:

void roaring_bitmap_printf_describe(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    printf("{");
    for (int i = 0; i < ra->size; ++i) {
        printf("%d: %s (%d)", ra->keys[i],
               get_full_container_name(ra->containers[i], ra->typecodes[i]),
               container_get_cardinality(ra->containers[i], ra->typecodes[i]));
        if (ra->typecodes[i] == SHARED_CONTAINER_TYPE) {
            printf("(shared count = %" PRIu32 " )",
                   croaring_refcount_get(
                       &(CAST_shared(ra->containers[i])->counter)));
        }

        if (i + 1 < ra->size) {
            printf(", ");
        }
    }
    printf("}");
}